

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void __thiscall GEO::LoggerStreamBuf::~LoggerStreamBuf(LoggerStreamBuf *this)

{
  LoggerStreamBuf *this_local;
  
  ~LoggerStreamBuf(this);
  operator_delete(this);
  return;
}

Assistant:

class NO_GEOGRAM_API LoggerStreamBuf : public std::stringbuf {
    public:
        LoggerStreamBuf(LoggerStream* loggerStream) :
  	loggerStream_(loggerStream) {
        }

    private:
        int sync() override;

    private:
        LoggerStream* loggerStream_;
    }